

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O0

FStartupScreen * FStartupScreen::CreateInstance(int max_progress)

{
  FTTYStartupScreen *this;
  int max_progress_local;
  
  addterm(DeleteStartupScreen,"DeleteStartupScreen");
  this = (FTTYStartupScreen *)operator_new(0x68);
  FTTYStartupScreen::FTTYStartupScreen(this,max_progress);
  return &this->super_FStartupScreen;
}

Assistant:

FStartupScreen *FStartupScreen::CreateInstance(int max_progress)
{
	atterm(DeleteStartupScreen);
	return new FTTYStartupScreen(max_progress);
}